

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ringbuf.c
# Opt level: O0

void adt_rbfh_swapBuffers(adt_rbfh_t *self,uint8_t *newAllocBuf,uint16_t newAllocLen)

{
  uint uVar1;
  uint uVar2;
  uint32_t allocSize;
  uint8_t *u8EndPtr;
  uint8_t *puStack_28;
  uint32_t copyLen;
  uint8_t *mark;
  uint16_t newAllocLen_local;
  uint8_t *newAllocBuf_local;
  adt_rbfh_t *self_local;
  
  if (((self->u8AllocBuf == (uint8_t *)0x0) || (self->u8ReadPtr == (uint8_t *)0x0)) ||
     (self->u8WritePtr == (uint8_t *)0x0)) {
    self->u8AllocBuf = newAllocBuf;
    self->u16AllocLen = newAllocLen;
    self->u8WritePtr = newAllocBuf;
    self->u8ReadPtr = newAllocBuf;
    self->u16NumElem = 0;
  }
  else {
    uVar1 = (uint)self->u16AllocLen * (uint)self->u8ElemSize;
    if (self->u8AllocBuf == (uint8_t *)0x0) {
      __assert_fail("self->u8AllocBuf != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ringbuf.c"
                    ,0x1fa,"void adt_rbfh_swapBuffers(adt_rbfh_t *, uint8_t *, uint16_t)");
    }
    if (uVar1 == 0) {
      __assert_fail("allocSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ringbuf.c"
                    ,0x1fb,"void adt_rbfh_swapBuffers(adt_rbfh_t *, uint8_t *, uint16_t)");
    }
    uVar2 = ((int)self->u8AllocBuf + uVar1) - (int)self->u8ReadPtr;
    if (uVar1 < uVar2) {
      __assert_fail("copyLen <= allocSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ringbuf.c"
                    ,0x1ff,"void adt_rbfh_swapBuffers(adt_rbfh_t *, uint8_t *, uint16_t)");
    }
    memcpy(newAllocBuf,self->u8ReadPtr,(ulong)uVar2);
    puStack_28 = newAllocBuf + uVar2;
    uVar2 = (int)self->u8ReadPtr - (int)self->u8AllocBuf;
    if (uVar1 < uVar2) {
      __assert_fail("copyLen <= allocSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ringbuf.c"
                    ,0x205,"void adt_rbfh_swapBuffers(adt_rbfh_t *, uint8_t *, uint16_t)");
    }
    if (uVar2 != 0) {
      memcpy(puStack_28,self->u8AllocBuf,(ulong)uVar2);
      puStack_28 = puStack_28 + uVar2;
    }
    free(self->u8AllocBuf);
    self->u8AllocBuf = newAllocBuf;
    self->u16AllocLen = newAllocLen;
    self->u8ReadPtr = newAllocBuf;
    self->u8WritePtr = puStack_28;
  }
  return;
}

Assistant:

static void adt_rbfh_swapBuffers(adt_rbfh_t* self, uint8_t *newAllocBuf, uint16_t newAllocLen)
{
   if ( (self->u8AllocBuf == 0) || (self->u8ReadPtr == 0) || (self->u8WritePtr == 0))
   {
      self->u8AllocBuf = newAllocBuf;
      self->u16AllocLen = newAllocLen;
      self->u8ReadPtr = self->u8WritePtr = newAllocBuf;
      self->u16NumElem = 0;
   }
   else
   {
      uint8_t *mark;
      uint32_t copyLen;
      uint8_t *u8EndPtr;
      uint32_t allocSize = ((uint32_t) self->u16AllocLen) * ((uint32_t) self->u8ElemSize);
      assert(self->u8AllocBuf != 0);
      assert(allocSize > 0);
      u8EndPtr = self->u8AllocBuf + allocSize;
      //Step 1.
      copyLen = (uint32_t) (u8EndPtr-self->u8ReadPtr);
      assert(copyLen <= allocSize);
      memcpy(newAllocBuf, self->u8ReadPtr, copyLen);
      mark = newAllocBuf+copyLen;

      //Step 2.
      copyLen =  (uint32_t) (self->u8ReadPtr - self->u8AllocBuf);
      assert(copyLen <= allocSize);
      if (copyLen > 0)
      {
         memcpy(mark, self->u8AllocBuf, copyLen);
         mark+=copyLen;
      }

      //Update pointers and free memory
      free(self->u8AllocBuf);
      self->u8AllocBuf = newAllocBuf;
      self->u16AllocLen = newAllocLen;
      self->u8ReadPtr = newAllocBuf;
      self->u8WritePtr = mark;
   }
}